

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_sparse_bit_array.cpp
# Opt level: O0

sparse_bit_array * __thiscall
crnlib::sparse_bit_array::operator&=(sparse_bit_array *this,sparse_bit_array *other)

{
  uint32 *puVar1;
  uint32 *puVar2;
  uint uVar3;
  sparse_bit_array *in_RSI;
  sparse_bit_array *in_RDI;
  uint32 c;
  uint j;
  uint32 oc;
  uint32 *s;
  uint32 *d;
  uint i;
  uint in_stack_000001b4;
  char *in_stack_000001b8;
  char *in_stack_000001c0;
  uint local_38;
  uint local_34;
  uint local_1c;
  
  if (in_RDI != in_RSI) {
    if (in_RSI->m_num_groups != in_RDI->m_num_groups) {
      crnlib_assert(in_stack_000001c0,in_stack_000001b8,in_stack_000001b4);
    }
    for (local_1c = 0; local_1c < in_RDI->m_num_groups; local_1c = local_1c + 1) {
      puVar1 = in_RDI->m_ppGroups[local_1c];
      if (puVar1 != (uint32 *)0x0) {
        puVar2 = in_RSI->m_ppGroups[local_1c];
        if (puVar2 == (uint32 *)0x0) {
          free_group((void *)0x197845);
          in_RDI->m_ppGroups[local_1c] = (uint32 *)0x0;
        }
        else {
          local_34 = 0;
          for (local_38 = 0; local_38 < 0x10; local_38 = local_38 + 1) {
            uVar3 = puVar1[local_38] & puVar2[local_38];
            puVar1[local_38] = uVar3;
            local_34 = uVar3 | local_34;
          }
          if (local_34 == 0) {
            free_group((void *)0x1978cb);
            in_RDI->m_ppGroups[local_1c] = (uint32 *)0x0;
          }
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

sparse_bit_array& sparse_bit_array::operator&=(const sparse_bit_array& other) {
  if (this == &other)
    return *this;

  CRNLIB_VERIFY(other.m_num_groups == m_num_groups);

  for (uint i = 0; i < m_num_groups; i++) {
    uint32* d = m_ppGroups[i];
    if (!d)
      continue;
    uint32* s = other.m_ppGroups[i];

    if (!s) {
      free_group(d);
      m_ppGroups[i] = NULL;
    } else {
      uint32 oc = 0;
      for (uint j = 0; j < cDWORDsPerGroup; j++) {
        uint32 c = d[j] & s[j];
        d[j] = c;
        oc |= c;
      }
      if (!oc) {
        free_group(d);
        m_ppGroups[i] = NULL;
      }
    }
  }

  return *this;
}